

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::AllContentModel::validateContentSpecial
          (AllContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *manager)

{
  QName *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  QName *inChild;
  XMLSize_t inIndex;
  QName *curChild;
  XMLSize_t outIndex;
  XMLSize_t i;
  ArrayJanitor<bool> jan;
  bool *elementSeen;
  SubstitutionGroupComparator comparator;
  XMLSize_t numRequiredSeen;
  XMLStringPool *pStringPool_local;
  GrammarResolver *pGrammarResolver_local;
  uint param_3_local;
  XMLSize_t childCount_local;
  QName **children_local;
  AllContentModel *this_local;
  bool *toDelete;
  
  if ((childCount == 0) && (((this->fHasOptionalContent & 1U) != 0 || (this->fNumRequired == 0)))) {
    this_local._7_1_ = 1;
  }
  else {
    comparator.fStringPool = (XMLStringPool *)0x0;
    if (childCount != 0) {
      SubstitutionGroupComparator::SubstitutionGroupComparator
                ((SubstitutionGroupComparator *)&elementSeen,pGrammarResolver,pStringPool);
      iVar2 = (*manager->_vptr_MemoryManager[3])(manager,this->fCount);
      toDelete = (bool *)CONCAT44(extraout_var,iVar2);
      ArrayJanitor<bool>::ArrayJanitor((ArrayJanitor<bool> *)&i,toDelete,manager);
      for (outIndex = 0; outIndex < this->fCount; outIndex = outIndex + 1) {
        toDelete[outIndex] = false;
      }
      for (curChild = (QName *)0x0; curChild < childCount;
          curChild = (QName *)((long)&(curChild->super_XSerializable)._vptr_XSerializable + 1)) {
        this_00 = children[(long)curChild];
        if (((this->fIsMixed & 1U) == 0) || (uVar3 = QName::getURI(this_00), uVar3 != 0xffffffff)) {
          for (inChild = (QName *)0x0; inChild < (QName *)this->fCount;
              inChild = (QName *)((long)&(inChild->super_XSerializable)._vptr_XSerializable + 1)) {
            bVar1 = SubstitutionGroupComparator::isEquivalentTo
                              ((SubstitutionGroupComparator *)&elementSeen,this_00,
                               this->fChildren[(long)inChild]);
            if (bVar1) {
              if ((toDelete[(long)inChild] & 1U) != 0) {
                *indexFailingChild = (XMLSize_t)curChild;
                this_local._7_1_ = 0;
                bVar1 = true;
                goto LAB_003c3699;
              }
              toDelete[(long)inChild] = true;
              if ((this->fChildOptional[(long)inChild] & 1U) == 0) {
                comparator.fStringPool =
                     (XMLStringPool *)
                     ((long)&((comparator.fStringPool)->super_XSerializable)._vptr_XSerializable + 1
                     );
              }
              break;
            }
          }
          if (inChild == (QName *)this->fCount) {
            *indexFailingChild = (XMLSize_t)curChild;
            this_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_003c3699;
          }
        }
      }
      bVar1 = false;
LAB_003c3699:
      ArrayJanitor<bool>::~ArrayJanitor((ArrayJanitor<bool> *)&i);
      SubstitutionGroupComparator::~SubstitutionGroupComparator
                ((SubstitutionGroupComparator *)&elementSeen);
      if (bVar1) goto LAB_003c36ee;
    }
    if (comparator.fStringPool == (XMLStringPool *)(ulong)this->fNumRequired) {
      this_local._7_1_ = 1;
    }
    else {
      *indexFailingChild = childCount;
      this_local._7_1_ = 0;
    }
  }
LAB_003c36ee:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AllContentModel::validateContentSpecial(QName** const          children
                                          , XMLSize_t               childCount
                                          , unsigned int
                                          , GrammarResolver*  const pGrammarResolver
                                          , XMLStringPool*    const pStringPool
                                          , XMLSize_t*              indexFailingChild
                                          , MemoryManager*    const manager) const
{
    // If <all> had minOccurs of zero and there are
    // no children to validate, trivially validate
    if (childCount == 0 && (fHasOptionalContent || !fNumRequired))
        return true;

    // keep track of the required element seen
    XMLSize_t numRequiredSeen = 0;

    if(childCount > 0)
    {
        SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

        // Check for duplicate element
        bool* elementSeen = (bool*) manager->allocate(fCount*sizeof(bool)); //new bool[fCount];

        const ArrayJanitor<bool> jan(elementSeen, manager);

        // initialize the array
        for (XMLSize_t i = 0; i < fCount; i++)
            elementSeen[i] = false;

        for (XMLSize_t outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* const curChild = children[outIndex];

            // If it's PCDATA, then we just accept that
            if (fIsMixed && curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            XMLSize_t inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                QName* const inChild = fChildren[inIndex];
                if ( comparator.isEquivalentTo(curChild, inChild)) {
                    // match
                    // If this element was seen already, indicate an error was
                    // found at the duplicate index.
                    if (elementSeen[inIndex]) {
                        *indexFailingChild=outIndex;
                        return false;
                    }
                    else
                        elementSeen[inIndex] = true;

                    if (!fChildOptional[inIndex])
                        numRequiredSeen++;

                    break;
                }
            }

            // We did not find this one, so the validation failed
            if (inIndex == fCount) {
                *indexFailingChild=outIndex;
                return false;
            }

        }
    }

    // Were all the required elements of the <all> encountered?
    if (numRequiredSeen != fNumRequired) {
        *indexFailingChild=childCount;
        return false;
    }

    // Everything seems to be ok, so return success
    return true;

}